

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ConvertScene(Discreet3DSImporter *this,aiScene *pcOut)

{
  uint uVar1;
  aiMaterial **ppaVar2;
  aiMaterial *this_00;
  aiLight **__dest;
  aiCamera **__dest_00;
  long lVar3;
  Scene *pSVar4;
  ulong uVar5;
  
  uVar5 = ((long)(this->mScene->mMaterials).
                 super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->mScene->mMaterials).
                 super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x66fd0eb66fd0eb67;
  uVar1 = (uint)uVar5;
  pcOut->mNumMaterials = uVar1;
  ppaVar2 = (aiMaterial **)operator_new__((uVar5 & 0xffffffff) << 3);
  pcOut->mMaterials = ppaVar2;
  if (uVar1 != 0) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      ConvertMaterial(this,(Material *)
                           ((long)&((this->mScene->mMaterials).
                                    super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_vptr_Material +
                           lVar3),this_00);
      pcOut->mMaterials[uVar5] = this_00;
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x2b8;
    } while (uVar5 < pcOut->mNumMaterials);
  }
  ConvertMeshes(this,pcOut);
  uVar5 = (long)(this->mScene->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mScene->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar1 = (uint)(uVar5 >> 3);
  pcOut->mNumLights = uVar1;
  if (uVar1 == 0) {
    pSVar4 = this->mScene;
  }
  else {
    uVar5 = uVar5 & 0x7fffffff8;
    __dest = (aiLight **)operator_new__(uVar5);
    pcOut->mLights = __dest;
    pSVar4 = this->mScene;
    memcpy(__dest,(pSVar4->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,uVar5);
  }
  uVar5 = (long)(pSVar4->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pSVar4->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar1 = (uint)(uVar5 >> 3);
  pcOut->mNumCameras = uVar1;
  if (uVar1 != 0) {
    uVar5 = uVar5 & 0x7fffffff8;
    __dest_00 = (aiCamera **)operator_new__(uVar5);
    pcOut->mCameras = __dest_00;
    memcpy(__dest_00,
           (this->mScene->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
           _M_impl.super__Vector_impl_data._M_start,uVar5);
    return;
  }
  return;
}

Assistant:

void Discreet3DSImporter::ConvertScene(aiScene* pcOut)
{
    // Allocate enough storage for all output materials
    pcOut->mNumMaterials = (unsigned int)mScene->mMaterials.size();
    pcOut->mMaterials    = new aiMaterial*[pcOut->mNumMaterials];

    //  ... and convert the 3DS materials to aiMaterial's
    for (unsigned int i = 0; i < pcOut->mNumMaterials;++i)
    {
        aiMaterial* pcNew = new aiMaterial();
        ConvertMaterial(mScene->mMaterials[i],*pcNew);
        pcOut->mMaterials[i] = pcNew;
    }

    // Generate the output mesh list
    ConvertMeshes(pcOut);

    // Now copy all light sources to the output scene
    pcOut->mNumLights = (unsigned int)mScene->mLights.size();
    if (pcOut->mNumLights)
    {
        pcOut->mLights = new aiLight*[pcOut->mNumLights];
        ::memcpy(pcOut->mLights,&mScene->mLights[0],sizeof(void*)*pcOut->mNumLights);
    }

    // Now copy all cameras to the output scene
    pcOut->mNumCameras = (unsigned int)mScene->mCameras.size();
    if (pcOut->mNumCameras)
    {
        pcOut->mCameras = new aiCamera*[pcOut->mNumCameras];
        ::memcpy(pcOut->mCameras,&mScene->mCameras[0],sizeof(void*)*pcOut->mNumCameras);
    }
}